

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O3

int space_mixer_get_in(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  undefined8 *puVar1;
  int code;
  undefined4 uVar2;
  
  if ((*(uint *)((long)segment->data + 8) <= location) ||
     (puVar1 = *(undefined8 **)(*segment->data + (ulong)location * 8), puVar1 == (undefined8 *)0x0))
  {
    code = 6;
LAB_00144c79:
    mixed_err(code);
    return 0;
  }
  switch(field) {
  case 0xc:
    *(undefined4 *)buffer = *(undefined4 *)(puVar1 + 1);
    *(undefined4 *)((long)buffer + 4) = *(undefined4 *)((long)puVar1 + 0xc);
    uVar2 = *(undefined4 *)(puVar1 + 2);
    goto LAB_00144cb2;
  case 0xe:
    *(undefined4 *)buffer = *(undefined4 *)((long)puVar1 + 0x14);
    *(undefined4 *)((long)buffer + 4) = *(undefined4 *)(puVar1 + 3);
    uVar2 = *(undefined4 *)((long)puVar1 + 0x1c);
LAB_00144cb2:
    *(undefined4 *)((long)buffer + 8) = uVar2;
    return 1;
  case 0x12:
    uVar2 = *(undefined4 *)(puVar1 + 4);
    break;
  case 0x13:
    uVar2 = *(undefined4 *)((long)puVar1 + 0x24);
    break;
  case 0x14:
    uVar2 = *(undefined4 *)(puVar1 + 5);
    break;
  default:
    if (field == 0x3f) {
      *(undefined1 *)buffer = *(undefined1 *)((long)puVar1 + 0xd9);
      return 1;
    }
    if (field == 0) {
      *(undefined8 *)buffer = *puVar1;
      return 1;
    }
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
    code = 7;
    goto LAB_00144c79;
  }
  *(undefined4 *)buffer = uVar2;
  return 1;
}

Assistant:

int space_mixer_get_in(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  
  if(data->count <= location){
    mixed_err(MIXED_INVALID_LOCATION);
    return 0;
  }
  
  struct space_source *source = data->sources[location];
  if(source == 0){
    mixed_err(MIXED_INVALID_LOCATION);
    return 0;
  }

  switch(field){
  case MIXED_BUFFER:
    *(struct mixed_buffer **)buffer = source->buffer;
    return 1;
  case MIXED_SPACE_MIN_DISTANCE:
    *(float *)buffer = source->min_distance;
    return 1;
  case MIXED_SPACE_MAX_DISTANCE:
    *(float *)buffer = source->max_distance;
    return 1;
  case MIXED_SPACE_ROLLOFF:
    *(float *)buffer = source->rolloff;
    return 1;
  case MIXED_SPACE_LOCATION:
  case MIXED_SPACE_VELOCITY:{
    float *value = (float *)buffer;
    switch(field){
    case MIXED_SPACE_LOCATION:
      value[0] = source->location[0];
      value[1] = source->location[1];
      value[2] = source->location[2];
      break;
    case MIXED_SPACE_VELOCITY:
      value[0] = source->velocity[0];
      value[1] = source->velocity[1];
      value[2] = source->velocity[2];
      break;
    }}
    return 1;
  case MIXED_SPACE_SPATIAL:
    *(bool *)buffer = source->spatial;
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}